

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

void __thiscall
chaiscript::dispatch::Proxy_Function_Callable_Impl<int_*(),_int_*(*)()>::
~Proxy_Function_Callable_Impl(Proxy_Function_Callable_Impl<int_*(),_int_*(*)()> *this)

{
  Proxy_Function_Callable_Impl<int_*(),_int_*(*)()> *this_local;
  
  ~Proxy_Function_Callable_Impl(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

explicit Proxy_Function_Callable_Impl(Callable f)
          : Proxy_Function_Impl_Base(detail::build_param_type_list(static_cast<Func *>(nullptr)))
          , m_f(std::move(f)) {
      }